

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O2

void genScript(string *material_name,string *image_name,string *scripts_dir)

{
  ostream *poVar1;
  ostream local_550 [8];
  ofstream ofs;
  stringstream local_350 [8];
  stringstream script_str;
  ostream local_340 [376];
  stringstream local_1c8 [8];
  stringstream file_path;
  ostream local_1b8 [376];
  string local_40 [32];
  
  std::__cxx11::stringstream::stringstream(local_350);
  std::__cxx11::stringstream::stringstream(local_1c8);
  poVar1 = std::operator<<(local_340,"material ");
  poVar1 = std::operator<<(poVar1,"Plugin/");
  poVar1 = std::operator<<(poVar1,(string *)material_name);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"{");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  technique");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  {");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    pass");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    {");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"      texture_unit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"      {");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        texture ");
  poVar1 = std::operator<<(poVar1,"Plugin/");
  poVar1 = std::operator<<(poVar1,(string *)image_name);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        filtering anistropic");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        max_anisotropy 16");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"      }");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    }");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"  }");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"}");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(local_1b8,(string *)scripts_dir);
  poVar1 = std::operator<<(poVar1,(string *)material_name);
  std::operator<<(poVar1,".material");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(local_550,local_40,_S_out);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::stringbuf::str();
  std::operator<<(local_550,local_40);
  std::__cxx11::string::~string(local_40);
  std::ofstream::close();
  std::ofstream::~ofstream(local_550);
  std::__cxx11::stringstream::~stringstream(local_1c8);
  std::__cxx11::stringstream::~stringstream(local_350);
  return;
}

Assistant:

void genScript(
    const std::string material_name,
    const std::string image_name,
    const std::string & scripts_dir){

    std::stringstream script_str;
    std::stringstream file_path;

    if (GENERATE_SCRIPT){

        script_str
        << "material " << MATERIAL_PREFIX << material_name
        << std::endl << "{"
        << std::endl << "  technique"
        << std::endl << "  {"
        << std::endl << "    pass"
        << std::endl << "    {"
        << std::endl << "      texture_unit"
        << std::endl << "      {"
        << std::endl << "        texture " << TEXTURE_PREFIX << image_name
        << std::endl << "        filtering anistropic"
        << std::endl << "        max_anisotropy 16"
        << std::endl << "      }"
        << std::endl << "    }"
        << std::endl << "  }"
        << std::endl << "}" << std::endl;

        file_path << scripts_dir << material_name << MATERIAL_EXT;

        /* Write to file */
        std::ofstream ofs(file_path.str());
        ofs << script_str.str();
        ofs.close();
    }
}